

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_Dialog.cxx
# Opt level: O0

void __thiscall Fl_Help_Dialog::value(Fl_Help_Dialog *this,char *f)

{
  Fl_Window *this_00;
  char *name;
  char *f_local;
  Fl_Help_Dialog *this_local;
  
  Fl_Widget::set_changed((Fl_Widget *)this->view_);
  Fl_Help_View::value(this->view_,f);
  this_00 = &this->window_->super_Fl_Window;
  name = Fl_Help_View::title(this->view_);
  Fl_Window::label(this_00,name);
  return;
}

Assistant:

void Fl_Help_Dialog::value(const char *f) {
  view_->set_changed();
  view_->value(f);
  window_->label(view_->title());
}